

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int idr_ensure_poolsize(archive_write *a,idr *idr,int cnt)

{
  uint uVar1;
  void *pvVar2;
  int in_EDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  int psize;
  int bk;
  void *p;
  
  if (*(int *)(in_RSI + 5) < in_EDX) {
    uVar1 = in_EDX + 0x7fU & 0xffffff80;
    pvVar2 = realloc((void *)*in_RSI,(long)(int)uVar1 << 6);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
      return -0x1e;
    }
    *in_RSI = pvVar2;
    *(uint *)(in_RSI + 5) = uVar1;
  }
  return 0;
}

Assistant:

static int
idr_ensure_poolsize(struct archive_write *a, struct idr *idr,
    int cnt)
{

	if (idr->pool_size < cnt) {
		void *p;
		const int bk = (1 << 7) - 1;
		int psize;

		psize = (cnt + bk) & ~bk;
		p = realloc(idr->idrent_pool, sizeof(struct idrent) * psize);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		idr->idrent_pool = (struct idrent *)p;
		idr->pool_size = psize;
	}
	return (ARCHIVE_OK);
}